

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  RefcountAndFlags *pRVar1;
  int *piVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  CordRep *rep;
  size_t sVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  CordRepBtree *pCVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined7 in_register_00000031;
  OpResult OVar15;
  
  bVar4 = (this->super_CordRep).storage[1];
  if ((int)CONCAT71(in_register_00000031,owned) == 0) {
    bVar5 = (this->super_CordRep).storage[2];
    sVar6 = (this->super_CordRep).length;
    pCVar12 = (CordRepBtree *)operator_new(0x40);
    (pCVar12->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar12->super_CordRep).length = sVar6;
    uVar14 = *(undefined8 *)((long)this->edges_ + 4);
    uVar8 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar9 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar11 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(pCVar12->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)pCVar12->edges_ + 4) = uVar14;
    *(undefined8 *)((long)pCVar12->edges_ + 0xc) = uVar8;
    *(undefined8 *)((long)pCVar12->edges_ + 0x14) = uVar9;
    *(undefined8 *)((long)pCVar12->edges_ + 0x1c) = uVar10;
    *(undefined8 *)((long)pCVar12->edges_ + 0x24) = uVar11;
    *(undefined4 *)((long)pCVar12->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    if (bVar5 <= bVar4) {
      __assert_fail("begin <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x277,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    uVar14 = 1;
    if (this->edges_ + (ulong)bVar4 + 1 != this->edges_ + bVar5) {
      uVar13 = (ulong)((uint)bVar4 * 8);
      do {
        lVar7 = *(long *)((long)this->edges_ + uVar13 + 8);
        if (lVar7 == 0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        piVar2 = (int *)(lVar7 + 8);
        *piVar2 = *piVar2 + 2;
        UNLOCK();
        uVar13 = uVar13 + 8;
      } while ((ulong)bVar5 * 8 - 8 != uVar13);
    }
  }
  else {
    rep = this->edges_[bVar4];
    if (rep == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
    }
    LOCK();
    pRVar1 = &rep->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) == 0 && (int)uVar3 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    uVar14 = 0;
    pCVar12 = this;
    if (uVar3 == 2) {
      CordRep::Destroy(rep);
    }
  }
  pCVar12->edges_[bVar4] = edge;
  (pCVar12->super_CordRep).length = (pCVar12->super_CordRep).length + delta;
  OVar15._8_8_ = uVar14;
  OVar15.tree = pCVar12;
  return OVar15;
}

Assistant:

OpResult CordRepBtree::SetEdge(bool owned, CordRep* edge, size_t delta) {
  OpResult result;
  const size_t idx = index(edge_type);
  if (owned) {
    result = {this, kSelf};
    CordRep::Unref(edges_[idx]);
  } else {
    // Create a copy containing all unchanged edges. Unchanged edges are the
    // open interval [begin, back) or [begin + 1, end) depending on `edge_type`.
    // We conveniently cover both case using a constexpr `shift` being 0 or 1
    // as `end :== back + 1`.
    result = {CopyRaw(length), kCopied};
    constexpr int shift = edge_type == kFront ? 1 : 0;
    for (CordRep* r : Edges(begin() + shift, back() + shift)) {
      CordRep::Ref(r);
    }
  }
  result.tree->edges_[idx] = edge;
  result.tree->length += delta;
  return result;
}